

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitIteratedLogical
          (ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
           *this,IteratedLogicalExpr e)

{
  BasicWriter<char> *pBVar1;
  size_t sVar2;
  char *pcVar3;
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  BasicStringRef<char> value_01;
  
  value.size_ = 3;
  value.data_ = "/* ";
  pBVar1 = fmt::BasicWriter<char>::operator<<(this->writer_,value);
  pcVar3 = internal::ExprInfo::INFO
           [*(uint *)e.super_BasicExpr<(mp::expr::Kind)66,_(mp::expr::Kind)67>.super_ExprBase.impl_]
           .str;
  sVar2 = strlen(pcVar3);
  value_00.size_ = sVar2;
  value_00.data_ = pcVar3;
  pBVar1 = fmt::BasicWriter<char>::operator<<(pBVar1,value_00);
  value_01.size_ = 4;
  value_01.data_ = " */ ";
  fmt::BasicWriter<char>::operator<<(pBVar1,value_01);
  pcVar3 = " && ";
  if (*(int *)e.super_BasicExpr<(mp::expr::Kind)66,_(mp::expr::Kind)67>.super_ExprBase.impl_ == 0x42
     ) {
    pcVar3 = " || ";
  }
  ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>::
  WriteArgs<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
            ((ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
              *)this,(BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>
                      )e.super_BasicExpr<(mp::expr::Kind)66,_(mp::expr::Kind)67>.super_ExprBase.
                       impl_,pcVar3,
             (*(int *)e.super_BasicExpr<(mp::expr::Kind)66,_(mp::expr::Kind)67>.super_ExprBase.impl_
             != 0x42) + 5);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitIteratedLogical(IteratedLogicalExpr e) {
  // There is no way to produce an AMPL forall/exists expression because
  // its indexing is not available any more. So we write a count expression
  // instead with a comment about the original expression.
  writer_ << "/* " << str(e.kind()) << " */ ";
  int prec = prec::LOGICAL_AND + 1;
  const char *op = " && ";
  if (e.kind() == expr::EXISTS) {
    prec = prec::LOGICAL_OR + 1;
    op = " || ";
  }
  WriteArgs(e, op, prec);
}